

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O2

pair<bool,_int> Fixpp::impl::matchTag<Fixpp::TagT<9u,Fixpp::Type::Int>,int>(StreamCursor *cursor)

{
  StreamBuf<char> *pSVar1;
  bool bVar2;
  pair<bool,_int> pVar3;
  Revert local_40;
  int local_18;
  uint local_14;
  int tag;
  int ret;
  
  pSVar1 = cursor->buf;
  local_40.eback = *(char **)&pSVar1->field_0x8;
  local_40.gptr = *(char **)&pSVar1->field_0x10;
  local_40.egptr = *(char **)&pSVar1->field_0x18;
  local_40.active = true;
  local_40.cursor = cursor;
  bVar2 = match_int_fast(&local_18,cursor);
  if (bVar2 && local_18 == 9) {
    bVar2 = match_literal_fast('=',cursor);
    if (bVar2) {
      bVar2 = TagMatcher<Fixpp::Type::Int>::matchValue((Return *)&local_14,cursor);
      if (bVar2) {
        local_40.active = false;
        pVar3 = (pair<bool,_int>)(((ulong)local_14 << 0x20) + 1);
        goto LAB_0045ee86;
      }
    }
  }
  pVar3.first = false;
  pVar3._1_3_ = 0;
  pVar3.second = 0;
LAB_0045ee86:
  StreamCursor::Revert::~Revert(&local_40);
  return pVar3;
}

Assistant:

std::pair<bool, Ret> matchTag(StreamCursor& cursor)
        {
            #define TRY_MATCH(...) \
            if (!__VA_ARGS__) \
               return std::make_pair(false, Ret {})

            StreamCursor::Revert revert(cursor);

            int tag;
            TRY_MATCH(match_int_fast(&tag, cursor));

            if (tag != Tag::Id)
               return std::make_pair(false, Ret {});

            TRY_MATCH(match_literal_fast('=', cursor));

            Ret ret;

            TRY_MATCH(TagMatcher<typename Tag::Type>::matchValue(&ret, cursor));

            revert.ignore();

            return std::make_pair(true, ret);

            #undef TRY_MATCH
        }